

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_unmark_one_of_two(REF_SUBDIV ref_subdiv,REF_INT e0,REF_INT e1)

{
  REF_NODE pRVar1;
  REF_EDGE pRVar2;
  REF_GLOB local_108;
  REF_GLOB local_100;
  REF_GLOB local_f8;
  long local_f0;
  long local_e0;
  REF_GLOB local_d8;
  REF_GLOB local_d0;
  REF_GLOB local_c8;
  long local_c0;
  long local_b0;
  REF_GLOB local_a8;
  REF_GLOB local_a0;
  REF_GLOB local_98;
  long local_90;
  long local_80;
  REF_GLOB local_78;
  REF_GLOB local_70;
  REF_GLOB local_68;
  long local_60;
  long local_50;
  REF_GLOB e1max;
  REF_GLOB e1min;
  REF_GLOB e0max;
  REF_GLOB e0min;
  REF_EDGE ref_edge;
  REF_NODE ref_node;
  REF_INT e1_local;
  REF_INT e0_local;
  REF_SUBDIV ref_subdiv_local;
  
  pRVar1 = ref_subdiv->grid->node;
  pRVar2 = ref_subdiv->edge;
  if (((pRVar2->e2n[e0 << 1] < 0) || (pRVar1->max <= pRVar2->e2n[e0 << 1])) ||
     (pRVar1->global[pRVar2->e2n[e0 << 1]] < 0)) {
    local_50 = -1;
  }
  else {
    local_50 = pRVar1->global[pRVar2->e2n[e0 << 1]];
  }
  if (((pRVar2->e2n[e0 * 2 + 1] < 0) || (pRVar1->max <= pRVar2->e2n[e0 * 2 + 1])) ||
     (pRVar1->global[pRVar2->e2n[e0 * 2 + 1]] < 0)) {
    local_60 = -1;
  }
  else {
    local_60 = pRVar1->global[pRVar2->e2n[e0 * 2 + 1]];
  }
  if (local_50 < local_60) {
    if (((pRVar2->e2n[e0 << 1] < 0) || (pRVar1->max <= pRVar2->e2n[e0 << 1])) ||
       (pRVar1->global[pRVar2->e2n[e0 << 1]] < 0)) {
      local_68 = -1;
    }
    else {
      local_68 = pRVar1->global[pRVar2->e2n[e0 << 1]];
    }
    local_70 = local_68;
  }
  else {
    if (((pRVar2->e2n[e0 * 2 + 1] < 0) || (pRVar1->max <= pRVar2->e2n[e0 * 2 + 1])) ||
       (pRVar1->global[pRVar2->e2n[e0 * 2 + 1]] < 0)) {
      local_78 = -1;
    }
    else {
      local_78 = pRVar1->global[pRVar2->e2n[e0 * 2 + 1]];
    }
    local_70 = local_78;
  }
  if (((pRVar2->e2n[e0 << 1] < 0) || (pRVar1->max <= pRVar2->e2n[e0 << 1])) ||
     (pRVar1->global[pRVar2->e2n[e0 << 1]] < 0)) {
    local_80 = -1;
  }
  else {
    local_80 = pRVar1->global[pRVar2->e2n[e0 << 1]];
  }
  if (((pRVar2->e2n[e0 * 2 + 1] < 0) || (pRVar1->max <= pRVar2->e2n[e0 * 2 + 1])) ||
     (pRVar1->global[pRVar2->e2n[e0 * 2 + 1]] < 0)) {
    local_90 = -1;
  }
  else {
    local_90 = pRVar1->global[pRVar2->e2n[e0 * 2 + 1]];
  }
  if (local_90 < local_80) {
    if (((pRVar2->e2n[e0 << 1] < 0) || (pRVar1->max <= pRVar2->e2n[e0 << 1])) ||
       (pRVar1->global[pRVar2->e2n[e0 << 1]] < 0)) {
      local_98 = -1;
    }
    else {
      local_98 = pRVar1->global[pRVar2->e2n[e0 << 1]];
    }
    local_a0 = local_98;
  }
  else {
    if (((pRVar2->e2n[e0 * 2 + 1] < 0) || (pRVar1->max <= pRVar2->e2n[e0 * 2 + 1])) ||
       (pRVar1->global[pRVar2->e2n[e0 * 2 + 1]] < 0)) {
      local_a8 = -1;
    }
    else {
      local_a8 = pRVar1->global[pRVar2->e2n[e0 * 2 + 1]];
    }
    local_a0 = local_a8;
  }
  if (((pRVar2->e2n[e1 << 1] < 0) || (pRVar1->max <= pRVar2->e2n[e1 << 1])) ||
     (pRVar1->global[pRVar2->e2n[e1 << 1]] < 0)) {
    local_b0 = -1;
  }
  else {
    local_b0 = pRVar1->global[pRVar2->e2n[e1 << 1]];
  }
  if (((pRVar2->e2n[e1 * 2 + 1] < 0) || (pRVar1->max <= pRVar2->e2n[e1 * 2 + 1])) ||
     (pRVar1->global[pRVar2->e2n[e1 * 2 + 1]] < 0)) {
    local_c0 = -1;
  }
  else {
    local_c0 = pRVar1->global[pRVar2->e2n[e1 * 2 + 1]];
  }
  if (local_b0 < local_c0) {
    if (((pRVar2->e2n[e1 << 1] < 0) || (pRVar1->max <= pRVar2->e2n[e1 << 1])) ||
       (pRVar1->global[pRVar2->e2n[e1 << 1]] < 0)) {
      local_c8 = -1;
    }
    else {
      local_c8 = pRVar1->global[pRVar2->e2n[e1 << 1]];
    }
    local_d0 = local_c8;
  }
  else {
    if (((pRVar2->e2n[e1 * 2 + 1] < 0) || (pRVar1->max <= pRVar2->e2n[e1 * 2 + 1])) ||
       (pRVar1->global[pRVar2->e2n[e1 * 2 + 1]] < 0)) {
      local_d8 = -1;
    }
    else {
      local_d8 = pRVar1->global[pRVar2->e2n[e1 * 2 + 1]];
    }
    local_d0 = local_d8;
  }
  if (((pRVar2->e2n[e1 << 1] < 0) || (pRVar1->max <= pRVar2->e2n[e1 << 1])) ||
     (pRVar1->global[pRVar2->e2n[e1 << 1]] < 0)) {
    local_e0 = -1;
  }
  else {
    local_e0 = pRVar1->global[pRVar2->e2n[e1 << 1]];
  }
  if (((pRVar2->e2n[e1 * 2 + 1] < 0) || (pRVar1->max <= pRVar2->e2n[e1 * 2 + 1])) ||
     (pRVar1->global[pRVar2->e2n[e1 * 2 + 1]] < 0)) {
    local_f0 = -1;
  }
  else {
    local_f0 = pRVar1->global[pRVar2->e2n[e1 * 2 + 1]];
  }
  if (local_f0 < local_e0) {
    if (((pRVar2->e2n[e1 << 1] < 0) || (pRVar1->max <= pRVar2->e2n[e1 << 1])) ||
       (pRVar1->global[pRVar2->e2n[e1 << 1]] < 0)) {
      local_f8 = -1;
    }
    else {
      local_f8 = pRVar1->global[pRVar2->e2n[e1 << 1]];
    }
    local_100 = local_f8;
  }
  else {
    if (((pRVar2->e2n[e1 * 2 + 1] < 0) || (pRVar1->max <= pRVar2->e2n[e1 * 2 + 1])) ||
       (pRVar1->global[pRVar2->e2n[e1 * 2 + 1]] < 0)) {
      local_108 = -1;
    }
    else {
      local_108 = pRVar1->global[pRVar2->e2n[e1 * 2 + 1]];
    }
    local_100 = local_108;
  }
  if (local_70 == local_d0) {
    if (local_a0 < local_100) {
      ref_subdiv->mark[e1] = 0;
    }
    else {
      ref_subdiv->mark[e0] = 0;
    }
  }
  else if (local_70 < local_d0) {
    ref_subdiv->mark[e1] = 0;
  }
  else {
    ref_subdiv->mark[e0] = 0;
  }
  if (ref_subdiv->debug != 0) {
    printf("unmark one of two proc %d edges %d %d\n",(ulong)(uint)ref_subdiv->grid->mpi->id,
           (ulong)(uint)e0,(ulong)(uint)e1);
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_unmark_one_of_two(REF_SUBDIV ref_subdiv,
                                                       REF_INT e0, REF_INT e1) {
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_EDGE ref_edge = ref_subdiv_edge(ref_subdiv);
  REF_GLOB e0min, e0max;
  REF_GLOB e1min, e1max;

  /* unmark the edge with the smallest edge globals */
  e0min = MIN(ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, e0)),
              ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, e0)));
  e0max = MAX(ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, e0)),
              ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, e0)));
  e1min = MIN(ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, e1)),
              ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, e1)));
  e1max = MAX(ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, e1)),
              ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, e1)));
  if (e0min == e1min) {
    if (e0max < e1max) {
      ref_subdiv_mark(ref_subdiv, e1) = 0;
    } else {
      ref_subdiv_mark(ref_subdiv, e0) = 0;
    }
  } else {
    if (e0min < e1min) {
      ref_subdiv_mark(ref_subdiv, e1) = 0;
    } else {
      ref_subdiv_mark(ref_subdiv, e0) = 0;
    }
  }

  if (ref_subdiv->debug)
    printf("unmark one of two proc %d edges %d %d\n",
           ref_mpi_rank(ref_subdiv_mpi(ref_subdiv)), e0, e1);

  return REF_SUCCESS;
}